

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O1

void mpiabi_comm_spawn_(char *command,char **argv,MPIABI_Fint *maxprocs,MPIABI_Fint *info,
                       MPIABI_Fint *root,MPIABI_Fint *comm,MPIABI_Fint *intercomm,
                       int *array_off_errcodes,MPIABI_Fint *ierror,size_t command_len,
                       size_t argv_len)

{
  mpi_comm_spawn_();
  return;
}

Assistant:

void mpiabi_comm_spawn_(
  const char * command,
  char ** argv,
  const MPIABI_Fint * maxprocs,
  const MPIABI_Fint * info,
  const MPIABI_Fint * root,
  const MPIABI_Fint * comm,
  MPIABI_Fint * intercomm,
  int * array_off_errcodes,
  MPIABI_Fint * ierror,
  size_t command_len,
  size_t argv_len
) {
  return mpi_comm_spawn_(
    command,
    argv,
    maxprocs,
    info,
    root,
    comm,
    intercomm,
    array_off_errcodes,
    ierror,
    command_len,
    argv_len
  );
}